

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O1

void __thiscall Memory::CacheAllocator::Unlock(CacheAllocator *this)

{
  BigBlock *pBVar1;
  DWORD local_28;
  DWORD local_24;
  DWORD oldProtect;
  DWORD oldProtect_1;
  
  if (this->verifiedAllZeroAndLockedDown == true) {
    pBVar1 = (this->super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>).
             super_ArenaData.bigBlocks;
    if (pBVar1 != (BigBlock *)0x0) {
      do {
        VirtualProtect(pBVar1->allocation + 1,pBVar1->allocation->pageCount * 0x1000 - 0x10,4,
                       &local_28);
        pBVar1 = (pBVar1->super_ArenaMemoryBlock).field_0.nextBigBlock;
      } while (pBVar1 != (BigBlock *)0x0);
    }
    pBVar1 = (this->super_ArenaAllocatorBase<Memory::StandAloneFreeListPolicy,_4UL,_false,_0UL>).
             super_ArenaData.fullBlocks;
    if (pBVar1 != (BigBlock *)0x0) {
      do {
        VirtualProtect(pBVar1->allocation + 1,pBVar1->allocation->pageCount * 0x1000 - 0x10,4,
                       &local_24);
        pBVar1 = (pBVar1->super_ArenaMemoryBlock).field_0.nextBigBlock;
      } while (pBVar1 != (BigBlock *)0x0);
    }
    this->verifiedAllZeroAndLockedDown = false;
  }
  return;
}

Assistant:

void CacheAllocator::Unlock()
{
    if (verifiedAllZeroAndLockedDown)
    {
        // restore the pages to read-write before returning to page allocator
        BigBlock *bigBlock = this->bigBlocks;
        while (bigBlock != NULL)
        {
            DWORD oldProtect;
            VirtualProtect(bigBlock->allocation->GetAddress(), bigBlock->allocation->GetSize(), PAGE_READWRITE, &oldProtect);
            bigBlock = bigBlock->nextBigBlock;
        }

        bigBlock = this->fullBlocks;
        while (bigBlock != NULL)
        {
            DWORD oldProtect;
            VirtualProtect(bigBlock->allocation->GetAddress(), bigBlock->allocation->GetSize(), PAGE_READWRITE, &oldProtect);
            bigBlock = bigBlock->nextBigBlock;
        }

        verifiedAllZeroAndLockedDown = false;
    }
}